

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,Block *block)

{
  pointer *ppTVar1;
  _Alloc_hider *p_Var2;
  pointer pTVar3;
  pointer pLVar4;
  size_t __n;
  size_type sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  ulong uVar8;
  pointer pTVar9;
  pointer pTVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  Newline *u;
  Newline *u_00;
  Newline *u_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_02;
  Newline *args_1;
  size_t mark;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string_view name;
  string tlabel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  ulong local_40;
  long local_38;
  
  local_68.field_2._M_allocated_capacity = 0x6f69747065637865;
  local_68.field_2._8_2_ = 0x736e;
  local_68._M_string_length = 10;
  local_68.field_2._M_local_buf[10] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->func_includes_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  Write(this);
  args_1 = (Newline *)0x1;
  name._M_str = (block->label)._M_dataplus._M_p;
  name._M_len = (block->label)._M_string_length;
  (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
            (&local_68,(CWriter *)this,name,true);
  WriteData(this,"WASM_RT_UNWIND_TARGET *",0x17);
  WriteData(this,local_68._M_dataplus._M_p,local_68._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [45])"_outer_target = wasm_rt_get_unwind_target();",u);
  WriteData(this,"WASM_RT_UNWIND_TARGET ",0x16);
  WriteData(this,local_68._M_dataplus._M_p,local_68._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [16])"_unwind_target;",u_00);
  WriteData(this,"if (!wasm_rt_try(",0x11);
  WriteData(this,local_68._M_dataplus._M_p,local_68._M_string_length);
  WriteData(this,"_unwind_target)) ",0x11);
  Write(this);
  DropTypes(this,(ulong)((long)(block->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(block->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  local_38 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  PushLabel(this,Try,&block->label,&(block->decl).sig,SUB81(args_1,0));
  std::vector<wabt::Type,std::allocator<wabt::Type>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (block->decl).sig.param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start,
             (block->decl).sig.param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish);
  WriteData(this,"wasm_rt_set_unwind_target(&",0x1b);
  WriteData(this,local_68._M_dataplus._M_p,local_68._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [17])"_unwind_target);",u_01);
  pTVar9 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)pTVar3 - (long)pTVar9 >> 4);
  uVar12 = (long)paVar11 * -0x5555555555555555;
  if (pTVar3 == (this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if ((long)pTVar3 - (long)pTVar9 == 0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = 1;
    if (pTVar3 != pTVar9) {
      uVar8 = uVar12;
    }
    local_40 = uVar8 + uVar12;
    if (0x2aaaaaaaaaaaaa9 < local_40) {
      local_40 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar8,uVar12)) {
      local_40 = 0x2aaaaaaaaaaaaaa;
    }
    local_48 = pTVar9;
    if (local_40 == 0) {
      pTVar9 = (pointer)0x0;
    }
    else {
      pTVar9 = (pointer)operator_new(local_40 * 0x30);
    }
    args = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)paVar11 * 0x10);
    p_Var2 = &(pTVar9->name)._M_dataplus + (long)paVar11 * 2;
    p_Var2->_M_p = (pointer)(p_Var2 + 2);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(&(pTVar9->name)._M_dataplus + (long)paVar11 * 2),local_68._M_dataplus._M_p
               ,local_68._M_dataplus._M_p + local_68._M_string_length);
    uVar8 = local_40;
    p_Var2[4] = (_Alloc_hider)uVar12;
    *(undefined1 *)(p_Var2 + 5) = 0;
    pTVar10 = pTVar9;
    if (pTVar3 != local_48) {
      paVar11 = &(local_48->name).field_2;
      paVar6 = &(pTVar9->name).field_2;
      do {
        paVar13 = paVar6;
        (&paVar13->_M_allocated_capacity)[-2] = (size_type)paVar13;
        if (paVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(char (**) [16])*(char (*) [16])(paVar11->_M_local_buf + -0x10)) {
          sVar5 = *(size_type *)(paVar11->_M_local_buf + 8);
          paVar13->_M_allocated_capacity = paVar11->_M_allocated_capacity;
          (&paVar13->_M_allocated_capacity)[1] = sVar5;
        }
        else {
          (&paVar13->_M_allocated_capacity)[-2] =
               (size_type)*(char (**) [16])*(char (*) [16])(paVar11->_M_local_buf + -0x10);
          paVar13->_M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        (&paVar13->_M_allocated_capacity)[-1] = *(size_type *)(paVar11->_M_local_buf + -8);
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)*(char (*) [16])(paVar11->_M_local_buf + -0x10) = paVar11;
        *(char *)((long)paVar11 + -8) = '\0';
        *(char *)((long)paVar11 + -7) = '\0';
        *(char *)((long)paVar11 + -6) = '\0';
        *(char *)((long)paVar11 + -5) = '\0';
        *(char *)((long)paVar11 + -4) = '\0';
        *(char *)((long)paVar11 + -3) = '\0';
        *(char *)((long)paVar11 + -2) = '\0';
        *(char *)((long)paVar11 + -1) = '\0';
        paVar11->_M_local_buf[0] = '\0';
        *(char *)(&paVar13->_M_allocated_capacity + 3) = paVar11->_M_local_buf[0x18];
        (&paVar13->_M_allocated_capacity)[2] =
             *(size_type *)*(char (*) [16])(paVar11->_M_local_buf + 0x10);
        args = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar11->_M_local_buf + 0x30);
        pTVar10 = (pointer)(paVar11->_M_local_buf + 0x20);
        paVar11 = args;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar13->_M_allocated_capacity + 6);
      } while (pTVar10 != pTVar3);
      pTVar10 = (pointer)(&paVar13->_M_allocated_capacity + 4);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)(this->try_catch_stack_).
                                     super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_48);
    }
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar9;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar10 + 1;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar9 + uVar8;
  }
  else {
    (pTVar3->name)._M_dataplus._M_p = (pointer)&(pTVar3->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pTVar3,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    pTVar3->try_catch_stack_size = uVar12;
    pTVar3->used = false;
    ppTVar1 = &(this->try_catch_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
    args = paVar11;
  }
  mark = local_38 >> 3;
  Write(this,&block->exprs);
  ResetTypeStack(this,mark);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])&local_68,u_02,(char (*) [16])args,args_1);
  Write(this);
  WriteData(this," else ",6);
  Write(this);
  pLVar4 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (pLVar4[-1].name)->_M_string_length;
  if (__n == (block->label)._M_string_length) {
    if (__n != 0) {
      iVar7 = bcmp(((pLVar4[-1].name)->_M_dataplus)._M_p,(block->label)._M_dataplus._M_p,__n);
      if (iVar7 != 0) goto LAB_001503ca;
    }
    if (pLVar4[-1].label_type == Try) {
      pLVar4[-1].label_type = Catch;
      if ((this->try_catch_stack_).
          super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].used == true) {
        WriteData(this,local_68._M_dataplus._M_p,local_68._M_string_length);
        WriteData(this,"_catch:;",8);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return mark;
    }
    __assert_fail("label_stack_.back().label_type == LabelType::Try",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xd0f,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
  }
LAB_001503ca:
  __assert_fail("label_stack_.back().name == block.label",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xd0e,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
}

Assistant:

size_t CWriter::BeginTry(const Block& block) {
  func_includes_.insert("exceptions");
  Write(OpenBrace()); /* beginning of try-catch or try_table */
  const std::string tlabel = DefineLabelName(block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try or try_table block */
  DropTypes(block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try or try_table block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}